

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_kiss.cpp
# Opt level: O2

void __thiscall
ear::WorkBufKiss<float>::WorkBufKiss
          (WorkBufKiss<float> *this,size_t n_fft,kissfft<float> *plan_forward,
          kissfft<float> *plan_reverse)

{
  allocator_type local_2a;
  allocator_type local_29;
  
  (this->super_FFTWorkBuf)._vptr_FFTWorkBuf = (_func_int **)&PTR__WorkBufKiss_00190cf0;
  kissfft<float>::kissfft(&this->plan_forward,plan_forward);
  kissfft<float>::kissfft(&this->plan_reverse,plan_reverse);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            (&this->reverse_tmp_input,n_fft,&local_29);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            (&this->reverse_tmp_output,n_fft,&local_2a);
  return;
}

Assistant:

WorkBufKiss(size_t n_fft, kissfft<Real> plan_forward,
                kissfft<Real> plan_reverse)
        : plan_forward(plan_forward),
          plan_reverse(plan_reverse),
          reverse_tmp_input(n_fft),
          reverse_tmp_output(n_fft) {}